

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

BatchedMatMulLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_batchedmatmul(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x415) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x415;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.batchedmatmul_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::BatchedMatMulLayerParams>(arena);
    (this->layer_).batchedmatmul_ = (BatchedMatMulLayerParams *)LVar2;
  }
  return (BatchedMatMulLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::BatchedMatMulLayerParams* NeuralNetworkLayer::_internal_mutable_batchedmatmul() {
  if (!_internal_has_batchedmatmul()) {
    clear_layer();
    set_has_batchedmatmul();
    layer_.batchedmatmul_ = CreateMaybeMessage< ::CoreML::Specification::BatchedMatMulLayerParams >(GetArenaForAllocation());
  }
  return layer_.batchedmatmul_;
}